

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O0

double __thiscall
despot::SimpleRockSample::ObsProb(SimpleRockSample *this,OBS_TYPE obs,State *state,ACT_TYPE action)

{
  double local_68;
  double local_58;
  double local_48;
  int rock_status;
  int rover_position;
  SimpleState *simple_state;
  ACT_TYPE action_local;
  State *state_local;
  OBS_TYPE obs_local;
  SimpleRockSample *this_local;
  
  if (action == 3) {
    if (*(int *)(state + 0x20) == 0) {
      local_48 = 1.0;
      if (obs != (long)*(int *)(state + 0x24)) {
        local_48 = 0.0;
      }
      return local_48;
    }
    if (*(int *)(state + 0x20) == 1) {
      local_58 = 0.8;
      if (obs != (long)*(int *)(state + 0x24)) {
        local_58 = 0.2;
      }
      return local_58;
    }
  }
  local_68 = 1.0;
  if (obs != 1) {
    local_68 = 0.0;
  }
  return local_68;
}

Assistant:

double SimpleRockSample::ObsProb(OBS_TYPE obs, const State& state,
	ACT_TYPE action) const {
	if (action == A_CHECK) {
		const SimpleState& simple_state = static_cast<const SimpleState&>(state);
		int rover_position = simple_state.rover_position;
		int rock_status = simple_state.rock_status;

		if (rover_position == LEFT) {
			// when the rover at LEFT, its observation is correct with probability 1
			return obs == rock_status;
		} else if (rover_position == MIDDLE) {
			// when the rover at MIDDLE, its observation is correct with probability 0.8
			return (obs == rock_status) ? 0.8 : 0.2;
		}
	}

	// when the actions are not A_CHECK, the rover does not receive any observations.
	// Assume it receives a default observation with probability 1.
	return obs == O_GOOD;
}